

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::drawElementsInstancedBaseVertex
          (ReferenceContext *this,deUint32 mode,int count,deUint32 type,void *indices,
          int instanceCount,int baseVertex)

{
  PrimitiveType primitiveType_00;
  int numElements;
  bool bVar1;
  deBool dVar2;
  IndexType type_00;
  deUint8 *local_90;
  VertexArray *local_88;
  DrawIndices local_78;
  PrimitiveList local_68;
  deUint8 *local_48;
  void *indicesPtr;
  VertexArray *pVStack_38;
  PrimitiveType primitiveType;
  VertexArray *vao;
  deUint8 *pdStack_28;
  int instanceCount_local;
  void *indices_local;
  int local_18;
  deUint32 type_local;
  int count_local;
  deUint32 mode_local;
  ReferenceContext *this_local;
  
  if (this->m_vertexArrayBinding == (VertexArray *)0x0) {
    local_88 = &this->m_clientVertexArray;
  }
  else {
    local_88 = this->m_vertexArrayBinding;
  }
  pVStack_38 = local_88;
  vao._4_4_ = instanceCount;
  pdStack_28 = (deUint8 *)indices;
  indices_local._4_4_ = type;
  local_18 = count;
  type_local = mode;
  _count_local = this;
  while (((indices_local._4_4_ == 0x1401 || (indices_local._4_4_ == 0x1403)) ||
         (indices_local._4_4_ == 0x1405))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      while ((-1 < local_18 && (-1 < vao._4_4_))) {
        dVar2 = ::deGetFalse();
        if (dVar2 == 0) {
          bVar1 = predrawErrorChecks(this,type_local);
          if (bVar1) {
            indicesPtr._4_4_ = rr_util::mapGLPrimitiveType(type_local);
            if (pVStack_38->m_elementArrayBufferBinding == (DataBuffer *)0x0) {
              local_90 = pdStack_28;
            }
            else {
              local_90 = rc::DataBuffer::getData(pVStack_38->m_elementArrayBufferBinding);
              local_90 = local_90 + (long)pdStack_28;
            }
            numElements = local_18;
            primitiveType_00 = indicesPtr._4_4_;
            local_48 = local_90;
            type_00 = rr_util::mapGLIndexType(indices_local._4_4_);
            rr::DrawIndices::DrawIndices(&local_78,local_90,type_00,baseVertex);
            rr::PrimitiveList::PrimitiveList(&local_68,primitiveType_00,numElements,&local_78);
            drawWithReference(this,&local_68,vao._4_4_);
          }
          return;
        }
      }
      setError(this,0x501);
      return;
    }
  }
  setError(this,0x500);
  return;
}

Assistant:

void ReferenceContext::drawElementsInstancedBaseVertex (deUint32 mode, int count, deUint32 type, const void *indices, int instanceCount, int baseVertex)
{
	rc::VertexArray& vao = (m_vertexArrayBinding) ? (*m_vertexArrayBinding) : (m_clientVertexArray);

	// Error conditions
	{
		RC_IF_ERROR(type != GL_UNSIGNED_BYTE &&
					type != GL_UNSIGNED_SHORT &&
					type != GL_UNSIGNED_INT, GL_INVALID_ENUM, RC_RET_VOID);
		RC_IF_ERROR(count < 0 || instanceCount < 0, GL_INVALID_VALUE, RC_RET_VOID);

		if (!predrawErrorChecks(mode))
			return;
	}

	// All is ok
	{
		const rr::PrimitiveType primitiveType	= sglr::rr_util::mapGLPrimitiveType(mode);
		const void*				indicesPtr		= (vao.m_elementArrayBufferBinding) ? (vao.m_elementArrayBufferBinding->getData() + ((const deUint8*)indices - (const deUint8*)DE_NULL)) : (indices);

		drawWithReference(rr::PrimitiveList(primitiveType, count, rr::DrawIndices(indicesPtr, sglr::rr_util::mapGLIndexType(type), baseVertex)), instanceCount);
	}
}